

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O3

void LoadObjectTypes(Level *NewLev,int radius)

{
  int iVar1;
  int iVar2;
  ObjectType *pOVar3;
  ALLEGRO_BITMAP *pAVar4;
  ALLEGRO_SAMPLE *pAVar5;
  ObjectType **ppOVar6;
  
  ppOVar6 = &NewLev->AllObjectTypes;
  ExpectToken(TK_OPENBRACE);
  while( true ) {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
        Error = 1;
      }
      return;
    }
    pOVar3 = NewObjectType();
    *ppOVar6 = pOVar3;
    ExpectToken(TK_STRING);
    pAVar4 = ObtainBitmap(Token.Text);
    (*ppOVar6)->Image = pAVar4;
    if (pAVar4 == (ALLEGRO_BITMAP *)0x0) break;
    iVar1 = al_get_bitmap_width((*ppOVar6)->Image);
    iVar2 = al_get_bitmap_height((*ppOVar6)->Image);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    (*ppOVar6)->Radius = iVar2 + radius;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_STRING);
    pAVar5 = ObtainSample(Token.Text);
    (*ppOVar6)->CollectNoise = pAVar5;
    ExpectToken(TK_CLOSEBRACE);
    ppOVar6 = &(*ppOVar6)->Next;
  }
  Error = 1;
  snprintf(ErrorText,0x400,"Could not load object image %s at line %d",0x11a88c,(ulong)(uint)Lines);
  return;
}

Assistant:

void LoadObjectTypes(struct Level *NewLev, int radius)
{
   struct ObjectType **NewObjectPtr = &NewLev->AllObjectTypes;
   int w, h;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               *NewObjectPtr = NewObjectType();

               ExpectToken(TK_STRING);
               if (!((*NewObjectPtr)->Image = ObtainBitmap(Token.Text))) {
                  Error = 1;
                  snprintf(ErrorText, sizeof(ErrorText),
                            "Could not load object image %s at line %d",
                            Token.Text, Lines);
                  return;
               }
               w = al_get_bitmap_width((*NewObjectPtr)->Image);
               h = al_get_bitmap_height((*NewObjectPtr)->Image);
               (*NewObjectPtr)->Radius = w > h ? w : h;
               (*NewObjectPtr)->Radius += radius;

               ExpectToken(TK_COMMA);
               ExpectToken(TK_STRING);

               /* this doesn't generate an error as it is permissible to have objects that don't make a noise when collected */
               (*NewObjectPtr)->CollectNoise = ObtainSample(Token.Text);

               ExpectToken(TK_CLOSEBRACE);
               NewObjectPtr = &(*NewObjectPtr)->Next;
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}